

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

void softfloat_init_mips64(void)

{
  double dVar1;
  union_float64 ur;
  union_float64 uc;
  union_float64 ub;
  union_float64 ua;
  
  dVar1 = fma(4.450147717014404e-308,1.1102230246251565e-16,4.450147717014403e-308);
  if (dVar1 != 4.450147717014404e-308) {
    force_soft_fma = true;
  }
  return;
}

Assistant:

void softfloat_init(void)
{
    union_float64 ua, ub, uc, ur;

    if (QEMU_NO_HARDFLOAT) {
        return;
    }
    /*
     * Test that the host's FMA is not obviously broken. For example,
     * glibc < 2.23 can perform an incorrect FMA on certain hosts; see
     *   https://sourceware.org/bugzilla/show_bug.cgi?id=13304
     */
    ua.s = 0x0020000000000001ULL;
    ub.s = 0x3ca0000000000000ULL;
    uc.s = 0x0020000000000000ULL;
    ur.h = fma(ua.h, ub.h, uc.h);
    if (ur.s != 0x0020000000000001ULL) {
        force_soft_fma = true;
    }
}